

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

int waitForError<int>(QPromise<void> *promise,int *initial)

{
  QPromiseBase<void> local_40;
  QPromiseBase<void> local_30;
  int local_1c;
  int *piStack_18;
  int error;
  int *initial_local;
  QPromise<void> *promise_local;
  
  local_1c = *initial;
  piStack_18 = initial;
  initial_local = (int *)promise;
  QtPromise::QPromiseBase<void>::
  fail<waitForError<int>(QtPromise::QPromise<void>const&,int_const&)::_lambda(int_const&)_1_>
            (&local_40,(anon_class_8_1_a7dec128 *)promise);
  QtPromise::QPromiseBase<void>::wait(&local_30,&local_40);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_30);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_40);
  return local_1c;
}

Assistant:

static inline E waitForError(const QtPromise::QPromise<void>& promise, const E& initial)
{
    E error(initial);
    promise
        .fail([&](const E& err) {
            error = err;
        })
        .wait();
    return error;
}